

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O1

void uv__async_stop(uv_loop_t *loop)

{
  uv__queue *puVar1;
  uv__queue *puVar2;
  uv__queue *puVar3;
  int iVar4;
  uv__queue queue;
  uv__queue local_30;
  
  if ((loop->async_io_watcher).fd != -1) {
    puVar1 = &loop->async_handles;
    local_30.next = (loop->async_handles).next;
    if (local_30.next == puVar1) {
      local_30.next = &local_30;
    }
    else {
      local_30.prev = (loop->async_handles).prev;
      (local_30.prev)->next = &local_30;
      puVar2 = (local_30.next)->prev;
      (loop->async_handles).prev = puVar2;
      puVar2->next = puVar1;
    }
    (local_30.next)->prev = &local_30;
LAB_0014f806:
    puVar2 = local_30.next;
    if (local_30.next != &local_30) {
      (local_30.next)->prev->next = (local_30.next)->next;
      (local_30.next)->next->prev = (local_30.next)->prev;
      (local_30.next)->next = puVar1;
      puVar3 = (loop->async_handles).prev;
      (local_30.next)->prev = puVar3;
      puVar3->next = local_30.next;
      (loop->async_handles).prev = local_30.next;
      LOCK();
      *(undefined4 *)&local_30.next[1].next = 1;
      UNLOCK();
      do {
        iVar4 = 0;
        do {
          if (*(int *)&puVar2[-4].prev == 0) goto LAB_0014f806;
          iVar4 = iVar4 + 1;
        } while (iVar4 != 0x3e5);
        sched_yield();
      } while( true );
    }
    iVar4 = loop->async_wfd;
    if (iVar4 != -1) {
      if (iVar4 != (loop->async_io_watcher).fd) {
        uv__close(iVar4);
      }
      loop->async_wfd = -1;
    }
    uv__io_stop(loop,&loop->async_io_watcher,1);
    uv__close((loop->async_io_watcher).fd);
    (loop->async_io_watcher).fd = -1;
  }
  return;
}

Assistant:

void uv__async_stop(uv_loop_t* loop) {
  struct uv__queue queue;
  struct uv__queue* q;
  uv_async_t* h;

  if (loop->async_io_watcher.fd == -1)
    return;

  /* Make sure no other thread is accessing the async handle fd after the loop
   * cleanup.
   */
  uv__queue_move(&loop->async_handles, &queue);
  while (!uv__queue_empty(&queue)) {
    q = uv__queue_head(&queue);
    h = uv__queue_data(q, uv_async_t, queue);

    uv__queue_remove(q);
    uv__queue_insert_tail(&loop->async_handles, q);

    uv__async_spin(h);
  }

  if (loop->async_wfd != -1) {
    if (loop->async_wfd != loop->async_io_watcher.fd)
      uv__close(loop->async_wfd);
    loop->async_wfd = -1;
  }

  uv__io_stop(loop, &loop->async_io_watcher, POLLIN);
  uv__close(loop->async_io_watcher.fd);
  loop->async_io_watcher.fd = -1;
}